

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
slang::function_ref<std::__cxx11::string()>::
callback_fn<slang::TimeTrace::beginTrace(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,function_ref<std::__cxx11::string()> *this,intptr_t callable)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (*(long **)this)[1];
  lVar2 = **(long **)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }